

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA.cpp
# Opt level: O2

void GetBGIPSolverCreatorInstances(Arguments *args,BGIP_SolverCreatorInterface **bgipsc_p)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BnB_JointTypeOrdering BVar6;
  int iVar7;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  BGIP_SolverCreatorInterface *pBVar10;
  _func_int **pp_Var11;
  E *this;
  _func_int **pp_Var12;
  undefined **ppuVar13;
  
  if (args->gmaa == MAAstarClassic) {
    return;
  }
  if (args->gmaa == MAAstar) {
    args->k = 0x7fffffff;
  }
  switch(args->bgsolver) {
  case BFS:
    iVar3 = args->useBGclustering;
    pBVar10 = (BGIP_SolverCreatorInterface *)operator_new(0x18);
    pp_Var12 = (_func_int **)(long)args->verbose;
    pp_Var11 = (_func_int **)(long)args->k;
    if (iVar3 == 0) {
      ppuVar13 = &PTR__BGIP_SolverCreatorInterface_00136108;
    }
    else {
      ppuVar13 = &PTR__BGIP_SolverCreatorInterface_00135e68;
    }
    goto LAB_001170f6;
  case AM:
    iVar3 = args->useBGclustering;
    pBVar10 = (BGIP_SolverCreatorInterface *)operator_new(0x28);
    iVar4 = args->nrAMRestarts;
    iVar5 = args->verbose;
    iVar7 = args->k;
    if (iVar3 == 0) {
      ppuVar13 = &PTR__BGIP_SolverCreatorInterface_00136580;
    }
    else {
      ppuVar13 = &PTR__BGIP_SolverCreatorInterface_001364a8;
    }
    pBVar10->_vptr_BGIP_SolverCreatorInterface = (_func_int **)ppuVar13;
    pBVar10[1]._vptr_BGIP_SolverCreatorInterface = (_func_int **)(long)iVar4;
    *(int *)&pBVar10[2]._vptr_BGIP_SolverCreatorInterface = iVar5;
    pBVar10[3]._vptr_BGIP_SolverCreatorInterface = (_func_int **)(long)iVar7;
    pBVar10[4]._vptr_BGIP_SolverCreatorInterface = (_func_int **)0x0;
    break;
  case CE:
    if (args->useBGclustering != 0) {
      this = (E *)__cxa_allocate_exception(0x28);
      E::E(this,"BGIP_SolverCE does not work yet with clustered policies");
      goto LAB_00117184;
    }
    pBVar10 = (BGIP_SolverCreatorInterface *)operator_new(0x40);
    bVar1 = args->CE_use_hard_threshold;
    pp_Var11 = (_func_int **)args->CE_alpha;
    pBVar10->_vptr_BGIP_SolverCreatorInterface =
         (_func_int **)&PTR__BGIP_SolverCreatorInterface_00135c38;
    pp_Var12 = (_func_int **)args->nrCEIterations;
    pp_Var8 = (_func_int **)args->nrCESamples;
    pp_Var9 = (_func_int **)args->nrCESamplesForUpdate;
    pBVar10[1]._vptr_BGIP_SolverCreatorInterface = (_func_int **)args->nrCERestarts;
    pBVar10[2]._vptr_BGIP_SolverCreatorInterface = pp_Var12;
    pBVar10[3]._vptr_BGIP_SolverCreatorInterface = pp_Var8;
    pBVar10[4]._vptr_BGIP_SolverCreatorInterface = pp_Var9;
    *(bool *)&pBVar10[5]._vptr_BGIP_SolverCreatorInterface = bVar1;
    pBVar10[6]._vptr_BGIP_SolverCreatorInterface = pp_Var11;
    pBVar10[7]._vptr_BGIP_SolverCreatorInterface = (_func_int **)0x0;
    break;
  case MaxPlus:
    iVar3 = args->useBGclustering;
    pBVar10 = (BGIP_SolverCreatorInterface *)operator_new(0x50);
    pp_Var11 = (_func_int **)args->maxplus_maxiter;
    pp_Var12 = (_func_int **)args->maxplus_verbose;
    iVar4 = args->k;
    pp_Var8 = (_func_int **)args->maxplus_nrRestarts;
    if (iVar3 == 0) {
      pBVar10->_vptr_BGIP_SolverCreatorInterface =
           (_func_int **)&PTR__BGIP_SolverCreator_MP_001369d0;
      pBVar10[1]._vptr_BGIP_SolverCreatorInterface = pp_Var11;
      std::__cxx11::string::string((string *)(pBVar10 + 2),(string *)&args->maxplus_updateT);
    }
    else {
      pBVar10->_vptr_BGIP_SolverCreatorInterface =
           (_func_int **)&PTR__BGIP_SolverCreator_MP_00136658;
      pBVar10[1]._vptr_BGIP_SolverCreatorInterface = pp_Var11;
      std::__cxx11::string::string((string *)(pBVar10 + 2),(string *)&args->maxplus_updateT);
    }
    pBVar10[6]._vptr_BGIP_SolverCreatorInterface = pp_Var12;
    pBVar10[8]._vptr_BGIP_SolverCreatorInterface = (_func_int **)(long)iVar4;
    pBVar10[9]._vptr_BGIP_SolverCreatorInterface = pp_Var8;
    break;
  case BnB:
    iVar3 = args->useBGclustering;
    pBVar10 = (BGIP_SolverCreatorInterface *)operator_new(0x30);
    iVar4 = args->verbose;
    iVar5 = args->k;
    bVar1 = args->BnB_keepAll;
    bVar2 = args->BnB_consistentCompleteInformationHeur;
    BVar6 = args->BnBJointTypeOrdering;
    if (iVar3 == 0) {
      ppuVar13 = &PTR__BGIP_SolverCreatorInterface_00136bf0;
    }
    else {
      ppuVar13 = &PTR__BGIP_SolverCreatorInterface_00136ac0;
    }
    pBVar10->_vptr_BGIP_SolverCreatorInterface = (_func_int **)ppuVar13;
    *(int *)&pBVar10[1]._vptr_BGIP_SolverCreatorInterface = iVar4 + -2;
    pBVar10[2]._vptr_BGIP_SolverCreatorInterface = (_func_int **)(long)iVar5;
    *(bool *)&pBVar10[3]._vptr_BGIP_SolverCreatorInterface = bVar1;
    *(BnB_JointTypeOrdering *)((long)&pBVar10[3]._vptr_BGIP_SolverCreatorInterface + 4) = BVar6;
    *(bool *)&pBVar10[4]._vptr_BGIP_SolverCreatorInterface = bVar2;
    pBVar10[5]._vptr_BGIP_SolverCreatorInterface = (_func_int **)0x0;
    break;
  case BFSNonInc:
    iVar3 = args->useBGclustering;
    pBVar10 = (BGIP_SolverCreatorInterface *)operator_new(0x18);
    pp_Var12 = (_func_int **)(long)args->verbose;
    pp_Var11 = (_func_int **)(long)args->k;
    if (iVar3 == 0) {
      ppuVar13 = &PTR__BGIP_SolverCreatorInterface_001363d8;
    }
    else {
      ppuVar13 = &PTR__BGIP_SolverCreatorInterface_00136278;
    }
LAB_001170f6:
    pBVar10->_vptr_BGIP_SolverCreatorInterface = (_func_int **)ppuVar13;
    pBVar10[1]._vptr_BGIP_SolverCreatorInterface = pp_Var12;
    pBVar10[2]._vptr_BGIP_SolverCreatorInterface = pp_Var11;
    break;
  case CGBG_MaxPlus:
    this = (E *)__cxa_allocate_exception(0x28);
    E::E(this,"CGBG max plus only works with factored Dec-POMDPs (use GMAAF instead)");
    goto LAB_00117184;
  default:
    this = (E *)__cxa_allocate_exception(0x28);
    E::E(this,"BGIP_Solver is not handled");
LAB_00117184:
    __cxa_throw(this,&E::typeinfo,E::~E);
  case Random:
    if (args->useBGclustering != 0) {
      this = (E *)__cxa_allocate_exception(0x28);
      E::E(this,"Random not implemented for clustered GMAA");
      goto LAB_00117184;
    }
    pBVar10 = (BGIP_SolverCreatorInterface *)operator_new(0x18);
    iVar3 = args->verbose;
    iVar4 = args->k;
    pBVar10->_vptr_BGIP_SolverCreatorInterface =
         (_func_int **)&PTR__BGIP_SolverCreatorInterface_00135e10;
    *(int *)&pBVar10[1]._vptr_BGIP_SolverCreatorInterface = iVar3;
    pBVar10[2]._vptr_BGIP_SolverCreatorInterface = (_func_int **)(long)iVar4;
  }
  *bgipsc_p = pBVar10;
  return;
}

Assistant:

void GetBGIPSolverCreatorInstances(
    ArgumentHandlers::Arguments &args,
    BGIP_SolverCreatorInterface * & bgipsc_p
    //BGIP_SolverCreatorInterface_T<JointPolicyPureVector> * &bgsc_p,
    //BGIP_SolverCreatorInterface_T<JointPolicyPureVectorForClusteredBG> * &bgscCluster_p
    )
{
    if(args.gmaa!=MAAstarClassic) // Classic uses a built-in solver
    {
        // for MAAstar we need to make sure we keep all the solutions,
        // so set k to INT_MAX
        if(args.gmaa==MAAstar)
            args.k=INT_MAX;
        switch(args.bgsolver)
        {
        case BFS:
            if(args.useBGclustering)
                bgipsc_p = 
                    new BGIP_SolverCreator_BFS<JointPolicyPureVectorForClusteredBG>(
                        args.verbose, args.k);
            else
                bgipsc_p = new BGIP_SolverCreator_BFS<JointPolicyPureVector>(args.verbose, args.k);
            break;
        case BFSNonInc:
            if(args.useBGclustering)
                bgipsc_p = 
                    new BGIP_SolverCreator_BFSNonInc<JointPolicyPureVectorForClusteredBG>(
                        args.verbose, args.k);
            else
                bgipsc_p = new BGIP_SolverCreator_BFSNonInc<JointPolicyPureVector>(
                    args.verbose, args.k);
            break;
        case AM:
            if(args.useBGclustering)
                bgipsc_p = 
                    new BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG>(
                        args.nrAMRestarts, args.verbose, args.k);
            else
                bgipsc_p = new BGIP_SolverCreator_AM<JointPolicyPureVector>(
                    args.nrAMRestarts, args.verbose, args.k);
            break;

        case CE:       
            if(args.useBGclustering)
                throw(E("BGIP_SolverCE does not work yet with clustered policies"));
            else
                bgipsc_p = new BGIP_SolverCreator_CE(
                    args.nrCERestarts,
                    args.nrCEIterations,
                    args.nrCESamples,
                    args.nrCESamplesForUpdate,
                    args.CE_use_hard_threshold,
                    args.CE_alpha);
            break;

        case MaxPlus:
            if(args.useBGclustering)
                bgipsc_p =
                    new BGIP_SolverCreator_MP<JointPolicyPureVectorForClusteredBG> (
                    args.maxplus_maxiter, args.maxplus_updateT, 
                    args.maxplus_verbose, args.maxplus_damping, 
                    args.k,//<- nr solutions to return by BG solver
                    args.maxplus_nrRestarts
                    );
            else
                bgipsc_p = new BGIP_SolverCreator_MP<JointPolicyPureVector> (
                    args.maxplus_maxiter, args.maxplus_updateT, 
                    args.maxplus_verbose, args.maxplus_damping, 
                    args.k,//<- nr solutions to return by BG solver
                    args.maxplus_nrRestarts
                    );
            break;
        case BnB:
            if(args.useBGclustering)
                bgipsc_p =
                    new BGIP_SolverCreator_BnB<JointPolicyPureVectorForClusteredBG>
                    (args.verbose -2 , args.k, args.BnB_keepAll,
                     args.BnBJointTypeOrdering,
                     args.BnB_consistentCompleteInformationHeur);
            else
                bgipsc_p = new BGIP_SolverCreator_BnB<JointPolicyPureVector>
                    (args.verbose -2 , args.k, args.BnB_keepAll,
                     args.BnBJointTypeOrdering,
                     args.BnB_consistentCompleteInformationHeur);
            break;
            
        case CGBG_MaxPlus:
            throw E("CGBG max plus only works with factored Dec-POMDPs (use GMAAF instead)");
            break;

        case Random:
            
            if(args.useBGclustering)
                throw E("Random not implemented for clustered GMAA");
            else
                bgipsc_p = new BGIP_SolverCreator_Random
                    (args.verbose, args.k);
            break;

        default:
            throw E("BGIP_Solver is not handled");
            break;
        }

        if(bgipsc_p == 0 && bgipsc_p == 0)
            throw(E("No BGIP Solver Creator instantiated"));
    }
}